

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void ft_glyphslot_done(FT_GlyphSlot slot)

{
  FT_Driver pFVar1;
  FT_Memory pFVar2;
  FT_Slot_DoneFunc p_Var3;
  FT_GlyphLoader loader;
  FT_Memory pFVar4;
  
  pFVar1 = slot->face->driver;
  pFVar2 = (pFVar1->root).memory;
  p_Var3 = pFVar1->clazz->done_slot;
  if (p_Var3 != (FT_Slot_DoneFunc)0x0) {
    (*p_Var3)(slot);
  }
  ft_glyphslot_free_bitmap(slot);
  if (slot->internal != (FT_Slot_Internal)0x0) {
    if ((((pFVar1->root).clazz)->module_flags & 0x200) == 0) {
      loader = slot->internal->loader;
      if (loader != (FT_GlyphLoader)0x0) {
        pFVar4 = loader->memory;
        FT_GlyphLoader_Reset(loader);
        (*pFVar4->free)(pFVar4,loader);
      }
      slot->internal->loader = (FT_GlyphLoader)0x0;
    }
    if (slot->internal != (FT_Slot_Internal)0x0) {
      (*pFVar2->free)(pFVar2,slot->internal);
    }
    slot->internal = (FT_Slot_Internal)0x0;
  }
  return;
}

Assistant:

static void
  ft_glyphslot_done( FT_GlyphSlot  slot )
  {
    FT_Driver        driver = slot->face->driver;
    FT_Driver_Class  clazz  = driver->clazz;
    FT_Memory        memory = driver->root.memory;


    if ( clazz->done_slot )
      clazz->done_slot( slot );

    /* free bitmap buffer if needed */
    ft_glyphslot_free_bitmap( slot );

    /* slot->internal might be NULL in out-of-memory situations */
    if ( slot->internal )
    {
      /* free glyph loader */
      if ( FT_DRIVER_USES_OUTLINES( driver ) )
      {
        FT_GlyphLoader_Done( slot->internal->loader );
        slot->internal->loader = NULL;
      }

      FT_FREE( slot->internal );
    }
  }